

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O3

void henson::Serialization<henson::MemoryBuffer>::load(BinaryBuffer *bb,MemoryBuffer *x)

{
  (*bb->_vptr_BinaryBuffer[1])(bb,&x->position,8);
  std::vector<char,_std::allocator<char>_>::resize(&x->buffer,x->position);
  (*bb->_vptr_BinaryBuffer[1])
            (bb,(x->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start,x->position);
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, MemoryBuffer& x)
    {
      henson::load(bb, x.position);
      x.buffer.resize(x.position);
      henson::load(bb, &x.buffer[0], x.position);
    }